

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CborValue::Serialize
          (Error *__return_storage_ptr__,CborValue *this,uint8_t *aBuf,size_t *aLength,
          size_t aMaxLength)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_112;
  v10 local_111;
  v10 *local_110;
  size_t local_108;
  string local_100;
  ssize_t local_e0;
  ssize_t written;
  size_t sStack_d0;
  bool condition;
  size_t aMaxLength_local;
  size_t *aLength_local;
  uint8_t *aBuf_local;
  CborValue *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  written._7_1_ = this->mCbor != (cn_cbor *)0x0;
  sStack_d0 = aMaxLength;
  aMaxLength_local = (size_t)aLength;
  aLength_local = (size_t *)aBuf;
  aBuf_local = (uint8_t *)this;
  this_local = (CborValue *)__return_storage_ptr__;
  if ((bool)written._7_1_) {
    local_e0 = cn_cbor_encoder_write(aBuf,0,aMaxLength,this->mCbor);
    if (local_e0 == -1) {
      Serialize::anon_class_1_0_00000001::operator()(&local_112);
      local_58 = &local_110;
      local_60 = &local_111;
      bVar1 = ::fmt::v10::operator()(local_60);
      local_108 = bVar1.size_;
      local_110 = (v10 *)bVar1.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_78 = local_110;
      sStack_70 = local_108;
      local_50 = &local_78;
      local_88 = local_110;
      local_80 = local_108;
      local_68 = &local_100;
      local_48 = local_88;
      sStack_40 = local_80;
      local_a8[0] = ::fmt::v10::
                    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = local_a8;
      local_18 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      ::fmt::v10::vformat_abi_cxx11_(&local_100,local_88,fmt,args);
      Error::Error(__return_storage_ptr__,kOutOfMemory,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      *(ssize_t *)aMaxLength_local = local_e0;
      Error::Error(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cbor.cpp"
                ,0x49,
                "Error ot::commissioner::CborValue::Serialize(uint8_t *, size_t &, size_t) const");
}

Assistant:

Error CborValue::Serialize(uint8_t *aBuf, size_t &aLength, size_t aMaxLength) const
{
    ASSERT(mCbor != nullptr);
    ssize_t written = cn_cbor_encoder_write(aBuf, 0, aMaxLength, mCbor);
    if (written == -1)
    {
        return ERROR_OUT_OF_MEMORY("serialize CBOR value");
    }

    aLength = written;
    return ERROR_NONE;
}